

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O3

void __thiscall FFlatVertexBuffer::CheckUpdate(FFlatVertexBuffer *this,sector_t *sector)

{
  sector_t *sector_00;
  extsector_t *peVar1;
  ulong uVar2;
  
  CheckPlanes(this,sector);
  sector_00 = sector_t::GetHeightSec(sector);
  if (sector_00 != (sector_t *)0x0) {
    CheckPlanes(this,sector_00);
  }
  peVar1 = sector->e;
  if ((peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    uVar2 = 0;
    do {
      CheckPlanes(this,(peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar2]->
                       model);
      uVar2 = uVar2 + 1;
      peVar1 = sector->e;
    } while (uVar2 < (peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CheckUpdate(sector_t *sector)
{
	CheckPlanes(sector);
	sector_t *hs = sector->GetHeightSec();
	if (hs != NULL) CheckPlanes(hs);
	for (unsigned i = 0; i < sector->e->XFloor.ffloors.Size(); i++)
		CheckPlanes(sector->e->XFloor.ffloors[i]->model);
}